

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

bool __thiscall pbrt::MixMaterial::IsTransparent(MixMaterial *this)

{
  ulong uVar1;
  ushort uVar2;
  bool bVar3;
  
  while( true ) {
    uVar1 = this->materials[0].
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    if ((0x5ffffffffffff < uVar1) &&
       (uVar2 = (ushort)(uVar1 >> 0x30), (uVar2 & 0xfffffffe) != 8 && 3 < uVar2 - 5)) {
      if (uVar2 - 9 < 2) {
        return true;
      }
      bVar3 = IsTransparent((MixMaterial *)(uVar1 & 0xffffffffffff));
      if (bVar3) {
        return true;
      }
    }
    uVar1 = this->materials[1].
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    if (uVar1 < 0x6000000000000) {
      return false;
    }
    uVar2 = (ushort)(uVar1 >> 0x30);
    if (uVar2 - 5 < 4) break;
    if ((uVar2 & 0xfffffffe) == 8) {
      return false;
    }
    if (uVar2 - 9 < 2) {
      return true;
    }
    this = (MixMaterial *)(uVar1 & 0xffffffffffff);
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    bool IsTransparent() const {
#ifdef PBRT_IS_GPU_CODE
        return false;
#else
        return materials[0].IsTransparent() || materials[1].IsTransparent();
#endif
    }